

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kitDsd.c
# Opt level: O2

int Kit_DsdFindLargeBox_rec(Kit_DsdNtk_t *pNtk,int Id,int Size)

{
  Kit_DsdObj_t KVar1;
  int Id_00;
  uint uVar2;
  Kit_DsdObj_t *pKVar3;
  uint uVar4;
  ulong uVar5;
  
  pKVar3 = Kit_DsdNtkObj(pNtk,Id);
  if (pKVar3 == (Kit_DsdObj_t *)0x0) {
    uVar4 = 0;
  }
  else {
    KVar1 = *pKVar3;
    if (((uint)KVar1 & 0x1c0) == 0x140 && Size < (int)((uint)KVar1 >> 0x1a)) {
      uVar4 = 1;
    }
    else {
      uVar4 = 0;
      for (uVar5 = 0; uVar5 < (uint)KVar1 >> 0x1a; uVar5 = uVar5 + 1) {
        Id_00 = Abc_Lit2Var((uint)*(ushort *)(&pKVar3[1].field_0x0 + uVar5 * 2));
        uVar2 = Kit_DsdFindLargeBox_rec(pNtk,Id_00,Size);
        uVar4 = uVar4 | uVar2;
        KVar1 = *pKVar3;
      }
    }
  }
  return uVar4;
}

Assistant:

int Kit_DsdFindLargeBox_rec( Kit_DsdNtk_t * pNtk, int Id, int Size )
{
    Kit_DsdObj_t * pObj;
    unsigned iLit, i, RetValue;
    pObj = Kit_DsdNtkObj( pNtk, Id );
    if ( pObj == NULL )
        return 0;
    if ( pObj->Type == KIT_DSD_PRIME && (int)pObj->nFans > Size )
        return 1;
    RetValue = 0;
    Kit_DsdObjForEachFanin( pNtk, pObj, iLit, i )
        RetValue |= Kit_DsdFindLargeBox_rec( pNtk, Abc_Lit2Var(iLit), Size );
    return RetValue;
}